

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

ly_set * lys_find_path(lys_module *cur_module,lys_node *cur_node,char *path)

{
  int iVar1;
  lys_module *plStack_30;
  int rc;
  ly_set *ret;
  char *path_local;
  lys_node *cur_node_local;
  lys_module *cur_module_local;
  
  if (((cur_module == (lys_module *)0x0) && (cur_node == (lys_node *)0x0)) || (path == (char *)0x0))
  {
    cur_module_local = (lys_module *)0x0;
  }
  else {
    ret = (ly_set *)path;
    path_local = (char *)cur_node;
    cur_node_local = (lys_node *)cur_module;
    iVar1 = resolve_schema_nodeid(path,cur_node,cur_module,(ly_set **)&stack0xffffffffffffffd0,1,1);
    if (iVar1 == -1) {
      cur_module_local = (lys_module *)0x0;
    }
    else {
      cur_module_local = plStack_30;
    }
  }
  return (ly_set *)cur_module_local;
}

Assistant:

ly_set *
lys_find_path(const struct lys_module *cur_module, const struct lys_node *cur_node, const char *path)
{
    struct ly_set *ret;
    int rc;

    if ((!cur_module && !cur_node) || !path) {
        return NULL;
    }

    rc = resolve_schema_nodeid(path, cur_node, cur_module, &ret, 1, 1);
    if (rc == -1) {
        return NULL;
    }

    return ret;
}